

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelA8,fe::PixelR8G8B8A8>
               (op_premultipliedAlpha *op,PixelA8 *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint8_t *puVar6;
  uint8_t uVar7;
  byte *pbVar8;
  int iVar9;
  uint8_t *puVar10;
  byte *pbVar11;
  
  bVar5 = check(src,dest);
  if ((bVar5) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    puVar10 = (dest->super_fe_image).data;
    pbVar11 = (src->super_fe_image).data;
    iVar9 = 0;
    iVar4 = iVar3;
    pbVar8 = pbVar11;
    puVar6 = puVar10;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        bVar1 = *pbVar11;
        uVar7 = (uint8_t)(((uint)bVar1 * (uint)bVar1) / 0xff);
        *puVar10 = uVar7;
        puVar10[1] = uVar7;
        puVar10[2] = uVar7;
        puVar10[3] = bVar1;
        puVar10 = puVar10 + (dest->super_fe_image).bytespp;
        pbVar11 = pbVar11 + (src->super_fe_image).bytespp;
      }
      pbVar11 = pbVar8 + (src->super_fe_image).pitch;
      puVar10 = puVar6 + (dest->super_fe_image).pitch;
      iVar9 = iVar9 + 1;
      iVar4 = iVar3;
      pbVar8 = pbVar11;
      puVar6 = puVar10;
    } while (iVar9 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }